

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::compiler::Version::_InternalSerialize
          (Version *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  string_view s;
  Version *pVVar1;
  bool bVar2;
  int32_t iVar3;
  int size;
  uint32_t *puVar4;
  char *data;
  UnknownFieldSet *unknown_fields;
  string_view local_48;
  string *local_38;
  string *_s;
  Version *pVStack_28;
  uint32_t cached_has_bits;
  Version *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Version *this_local;
  
  _s._4_4_ = 0;
  pVStack_28 = this;
  this_ = (Version *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar4 = protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  pVVar1 = this_;
  _s._4_4_ = *puVar4;
  if ((_s._4_4_ & 2) != 0) {
    iVar3 = _internal_major(pVStack_28);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             ((EpsCopyOutputStream *)pVVar1,iVar3,(uint8_t *)stream_local);
  }
  pVVar1 = this_;
  if ((_s._4_4_ & 4) != 0) {
    iVar3 = _internal_minor(pVStack_28);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                             ((EpsCopyOutputStream *)pVVar1,iVar3,(uint8_t *)stream_local);
  }
  pVVar1 = this_;
  if ((_s._4_4_ & 8) != 0) {
    iVar3 = _internal_patch(pVStack_28);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                             ((EpsCopyOutputStream *)pVVar1,iVar3,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_suffix_abi_cxx11_(pVStack_28);
    data = (char *)std::__cxx11::string::data();
    size = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"google.protobuf.compiler.Version.suffix");
    protobuf::internal::WireFormat::VerifyUTF8StringNamedField(data,size,SERIALIZE,local_48);
    pVVar1 = this_;
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pVVar1,4,s,(uint8_t *)stream_local);
  }
  bVar2 = protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(pVStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         protobuf::internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pVStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Version::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Version& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.Version)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 major = 1;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_major(), target);
  }

  // optional int32 minor = 2;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_minor(), target);
  }

  // optional int32 patch = 3;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_patch(), target);
  }

  // optional string suffix = 4;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_suffix();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.compiler.Version.suffix");
    target = stream->WriteStringMaybeAliased(4, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.Version)
  return target;
}